

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# videomenu.cpp
# Opt level: O2

void M_SetDefaultMode(void)

{
  FIntCVar::operator=(&vid_defwidth,screen->VideoWidth);
  FIntCVar::operator=(&vid_defheight,screen->VideoHeight);
  FIntCVar::operator=(&vid_defbits,DisplayBits);
  testingmode = 0;
  SetModesMenu(screen->VideoWidth,screen->VideoHeight,DisplayBits);
  return;
}

Assistant:

void M_SetDefaultMode ()
{
	// Make current resolution the default
	vid_defwidth = screen->VideoWidth;
	vid_defheight = screen->VideoHeight;
	vid_defbits = DisplayBits;
	testingmode = 0;
	SetModesMenu (screen->VideoWidth, screen->VideoHeight, DisplayBits);
}